

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O0

os_interface * os_interface_linux_add(os_interface_listener *if_listener)

{
  list_entity *plVar1;
  list_entity *plVar2;
  os_interface *data;
  os_interface_listener *if_listener_local;
  
  if (if_listener->data == (os_interface *)0x0) {
    if ((if_listener->name == (char *)0x0) || (*if_listener->name == '\0')) {
      if_listener->name = "any";
    }
    if_listener_local = (os_interface_listener *)_add_interface(if_listener->name);
    if ((os_interface *)if_listener_local == (os_interface *)0x0) {
      if_listener_local = (os_interface_listener *)0x0;
    }
    else {
      if_listener->data = (os_interface *)if_listener_local;
      plVar2 = &if_listener->_node;
      plVar1 = (((os_interface *)if_listener_local)->_listeners).prev;
      plVar2->next = &((os_interface *)if_listener_local)->_listeners;
      (if_listener->_node).prev = plVar1;
      (((os_interface *)if_listener_local)->_listeners).prev = plVar2;
      plVar1->next = plVar2;
      if (((if_listener->mesh & 1U) != 0) && (if_listener->name != "any")) {
        if (((((os_interface *)if_listener_local)->_internal).mesh_counter == 0) &&
           (((((os_interface *)if_listener_local)->_internal).ignore_mesh & 1U) == 0)) {
          _init_mesh((os_interface *)if_listener_local);
        }
        (((os_interface *)if_listener_local)->_internal).mesh_counter =
             (((os_interface *)if_listener_local)->_internal).mesh_counter + 1;
      }
      if_listener->_dirty = true;
      oonf_timer_start_ext(&((os_interface *)if_listener_local)->_change_timer,200,200);
    }
  }
  else {
    if_listener_local = (os_interface_listener *)if_listener->data;
  }
  return (os_interface *)if_listener_local;
}

Assistant:

struct os_interface *
os_interface_linux_add(struct os_interface_listener *if_listener) {
  struct os_interface *data;

  if (if_listener->data) {
    /* interface is already hooked up to data */
    return if_listener->data;
  }

  if (!if_listener->name || !if_listener->name[0]) {
    if_listener->name = _ANY_INTERFACE;
  }

  data = _add_interface(if_listener->name);
  if (!data) {
    return NULL;
  }

  /* hook into interface data */
  if_listener->data = data;
  list_add_tail(&data->_listeners, &if_listener->_node);

  if (if_listener->mesh && if_listener->name != _ANY_INTERFACE) {
    if (data->_internal.mesh_counter == 0 && !data->_internal.ignore_mesh) {
      _init_mesh(data);
    }
    data->_internal.mesh_counter++;
  }

  /* trigger interface change listener if necessary */
  if_listener->_dirty = true;
  oonf_timer_start(&data->_change_timer, 200);

  return data;
}